

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target)

{
  string *str;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  undefined1 local_21;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *dir;
  
  local_21 = 0;
  local_20 = target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_58,"CMakeFiles/");
  str = cmGeneratorTarget::GetName_abi_cxx11_(local_20);
  cmAlphaNum::cmAlphaNum(&local_88,str);
  cmStrCat<>(__return_storage_ptr__,&local_58,&local_88);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat("CMakeFiles/", target->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}